

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r603_handler.cpp
# Opt level: O2

bool __thiscall
ismsnoop::R603Handler::looks_like_the_info_text
          (R603Handler *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *buffer,int *next)

{
  uint *puVar1;
  bool bVar2;
  
  puVar1 = (buffer->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (((((*puVar1 & 0xfffbffff) == 0) && (puVar1[3] == 0x20000)) && (puVar1[4] == 0x1010000)) &&
     (puVar1[5] == 0x1010101)) {
    *next = 9;
    bVar2 = true;
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool R603Handler::looks_like_the_info_text(const std::vector<uint32_t> & buffer, int * next)
{
	if ((buffer[0] == 262144 || buffer[0] == 0)
		&& buffer[3] == 131072
		&& buffer[4] == 16842752
		&& buffer[5] == 16843009)
	{
		*next = 9;
		return true;
	}

	return false;
}